

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O2

UINT8 __thiscall TreeItem::insertChildAfter(TreeItem *this,TreeItem *item,TreeItem *newItem)

{
  UINT8 UVar1;
  _List_iterator<TreeItem_*> _Var2;
  TreeItem *local_18;
  TreeItem *local_10;
  
  local_18 = newItem;
  local_10 = item;
  _Var2 = std::
          __find_if<std::_List_iterator<TreeItem*>,__gnu_cxx::__ops::_Iter_equals_val<TreeItem*const>>
                    ((this->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>.
                     _M_impl._M_node.super__List_node_base._M_next,this,&local_10);
  if ((TreeItem *)_Var2._M_node == this) {
    UVar1 = '\b';
  }
  else {
    std::__cxx11::list<TreeItem_*,_std::allocator<TreeItem_*>_>::insert
              (&this->childItems,(_Var2._M_node)->_M_next,&local_18);
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

UINT8 TreeItem::insertChildAfter(TreeItem *item, TreeItem *newItem)
{
    std::list<TreeItem*>::iterator found = std::find(childItems.begin(), childItems.end(), item);
    if (found == childItems.end())
        return U_ITEM_NOT_FOUND;
    childItems.insert(++found, newItem);
    return U_SUCCESS;
}